

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rule_builder.cpp
# Opt level: O3

void __thiscall ccs::RuleBuilder::Impl::set(Impl *this,string *name,string *value)

{
  tuple<ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_> tVar1;
  __uniq_ptr_impl<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> local_40;
  StringVal local_38;
  
  tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
  super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl =
       (_Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
       operator_new(0xc0);
  *(undefined ***)
   tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
   super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl = &PTR__PropDef_0015b000;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                   .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                      .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x18);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x10) = 0;
  *(undefined1 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x18) = 0;
  *(undefined4 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x28) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x30) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x38) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x40) = 0;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x48) = 0;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                   .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x50) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                      .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x60);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x58) = 0;
  *(undefined1 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x60) = 0;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                   .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x70) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                      .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x80);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x78) = 0;
  *(undefined1 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x80) = 0;
  *(long **)((long)tVar1.
                   super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                   .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x90) =
       (long *)((long)tVar1.
                      super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                      .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0xa0);
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0xa0) =
       0x6e776f6e6b6e753c;
  *(undefined2 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0xa8) = 0x3e;
  *(long *)((long)tVar1.
                  super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x98) = 9;
  *(undefined4 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0xb0) = 0;
  *(undefined1 *)
   ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0xb8) = 0;
  std::__cxx11::string::_M_assign
            ((string *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                    .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8));
  StringVal::StringVal(&local_38,value);
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::operator=
            ((vector<ccs::StringElem,_std::allocator<ccs::StringElem>_> *)
             ((long)tVar1.
                    super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                    .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x30),
             &local_38.elements_);
  ((Value *)
  ((long)tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
         super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x28))->which_ = String;
  Value::str((Value *)((long)tVar1.
                             super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                             .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 0x28)
            );
  std::vector<ccs::StringElem,_std::allocator<ccs::StringElem>_>::~vector(&local_38.elements_);
  local_40._M_t.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
  .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl =
       (tuple<ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
       (tuple<ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
       tVar1.super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
       super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl;
  std::
  vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
  ::emplace_back<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>
            ((vector<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>,std::allocator<std::unique_ptr<ccs::ast::AstRule,std::default_delete<ccs::ast::AstRule>>>>
              *)&((this->ast)._M_t.
                  super___uniq_ptr_impl<ccs::ast::Nested,_std::default_delete<ccs::ast::Nested>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_ccs::ast::Nested_*,_std::default_delete<ccs::ast::Nested>_>
                  .super__Head_base<0UL,_ccs::ast::Nested_*,_false>._M_head_impl)->rules_,
             (unique_ptr<ccs::ast::AstRule,_std::default_delete<ccs::ast::AstRule>_> *)&local_40);
  if ((_Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>)
      local_40._M_t.
      super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>.
      super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl != (AstRule *)0x0) {
    (**(code **)(*(long *)local_40._M_t.
                          super__Tuple_impl<0UL,_ccs::ast::AstRule_*,_std::default_delete<ccs::ast::AstRule>_>
                          .super__Head_base<0UL,_ccs::ast::AstRule_*,_false>._M_head_impl + 8))();
  }
  return;
}

Assistant:

void set(const std::string &name, const std::string &value) {
    auto def = std::make_unique<ast::PropDef>();
    def->name_ = name;
    def->value_.setString(StringVal(value));
    ast->addRule(std::move(def));
  }